

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O1

unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true> __thiscall
duckdb::AddConstraintInfo::Deserialize(AddConstraintInfo *this,Deserializer *deserializer)

{
  int iVar1;
  _Head_base<0UL,_duckdb::AddConstraintInfo_*,_false> this_00;
  pointer pAVar2;
  pointer *__ptr;
  byte bVar3;
  _Head_base<0UL,_duckdb::Constraint_*,_false> _Var4;
  unique_ptr<duckdb::AddConstraintInfo,_std::default_delete<duckdb::AddConstraintInfo>,_true> result
  ;
  _Tuple_impl<0UL,_duckdb::AddConstraintInfo_*,_std::default_delete<duckdb::AddConstraintInfo>_>
  local_38;
  Constraint *local_30;
  
  this_00._M_head_impl = (AddConstraintInfo *)operator_new(0x80);
  AddConstraintInfo(this_00._M_head_impl);
  local_38.super__Head_base<0UL,_duckdb::AddConstraintInfo_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::AddConstraintInfo_*,_false>)
       (_Head_base<0UL,_duckdb::AddConstraintInfo_*,_false>)this_00._M_head_impl;
  pAVar2 = unique_ptr<duckdb::AddConstraintInfo,_std::default_delete<duckdb::AddConstraintInfo>,_true>
           ::operator->((unique_ptr<duckdb::AddConstraintInfo,_std::default_delete<duckdb::AddConstraintInfo>,_true>
                         *)&local_38);
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,400,"constraint");
  bVar3 = (byte)iVar1;
  if (bVar3 == 0) {
    _Var4._M_head_impl =
         (pAVar2->constraint).
         super_unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>._M_t.
         super___uniq_ptr_impl<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Constraint_*,_std::default_delete<duckdb::Constraint>_>.
         super__Head_base<0UL,_duckdb::Constraint_*,_false>._M_head_impl;
    (pAVar2->constraint).
    super_unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>._M_t.
    super___uniq_ptr_impl<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Constraint_*,_std::default_delete<duckdb::Constraint>_>.
    super__Head_base<0UL,_duckdb::Constraint_*,_false>._M_head_impl = (Constraint *)0x0;
    if (_Var4._M_head_impl == (Constraint *)0x0) {
      bVar3 = 0;
      goto LAB_01775bec;
    }
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar1 == '\0') {
      local_30 = (Constraint *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      Constraint::Deserialize((Constraint *)&local_30,deserializer);
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var4._M_head_impl =
         (pAVar2->constraint).
         super_unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>._M_t.
         super___uniq_ptr_impl<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Constraint_*,_std::default_delete<duckdb::Constraint>_>.
         super__Head_base<0UL,_duckdb::Constraint_*,_false>._M_head_impl;
    (pAVar2->constraint).
    super_unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>._M_t.
    super___uniq_ptr_impl<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Constraint_*,_std::default_delete<duckdb::Constraint>_>.
    super__Head_base<0UL,_duckdb::Constraint_*,_false>._M_head_impl = local_30;
    if (_Var4._M_head_impl == (Constraint *)0x0) {
      bVar3 = 1;
      goto LAB_01775bec;
    }
  }
  (*(_Var4._M_head_impl)->_vptr_Constraint[1])();
LAB_01775bec:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar3);
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)local_38.super__Head_base<0UL,_duckdb::AddConstraintInfo_*,_false>._M_head_impl
  ;
  return (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
         (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)this;
}

Assistant:

unique_ptr<AlterTableInfo> AddConstraintInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<AddConstraintInfo>(new AddConstraintInfo());
	deserializer.ReadPropertyWithDefault<unique_ptr<Constraint>>(400, "constraint", result->constraint);
	return std::move(result);
}